

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatCnfReader.c
# Opt level: O0

int xSAT_SolverParseDimacs(FILE *pFile,xSAT_Solver_t **p)

{
  int iVar1;
  char *pText_00;
  int Value;
  char *pText;
  xSAT_Solver_t **p_local;
  FILE *pFile_local;
  
  pText_00 = xSAT_FileRead(pFile);
  iVar1 = xSAT_ParseDimacs(pText_00,p);
  if (pText_00 != (char *)0x0) {
    free(pText_00);
  }
  return iVar1;
}

Assistant:

int xSAT_SolverParseDimacs( FILE * pFile, xSAT_Solver_t ** p )
{
    char * pText;
    int  Value;
    pText = xSAT_FileRead( pFile );
    Value = xSAT_ParseDimacs( pText, p );
    ABC_FREE( pText );
    return Value;
}